

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.h
# Opt level: O1

set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_> *
__thiscall
spvtools::val::ValidationState_t::GetExecutionModels(ValidationState_t *this,uint32_t entry_point)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  ulong uVar3;
  __node_base_ptr p_Var4;
  __node_base_ptr p_Var5;
  
  uVar1 = (this->entry_point_to_execution_models_)._M_h._M_bucket_count;
  uVar3 = (ulong)entry_point % uVar1;
  p_Var4 = (this->entry_point_to_execution_models_)._M_h._M_buckets[uVar3];
  p_Var5 = (__node_base_ptr)0x0;
  if ((p_Var4 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var4->_M_nxt, p_Var5 = p_Var4,
     *(uint32_t *)&p_Var4->_M_nxt[1]._M_nxt != entry_point)) {
    while (p_Var4 = p_Var2, p_Var2 = p_Var4->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var5 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var2[1]._M_nxt % uVar1 != uVar3) ||
         (p_Var5 = p_Var4, *(uint *)&p_Var2[1]._M_nxt == entry_point)) goto LAB_001c1673;
    }
    p_Var5 = (__node_base_ptr)0x0;
  }
LAB_001c1673:
  if (p_Var5 == (__node_base_ptr)0x0) {
    p_Var2 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var2 = p_Var5->_M_nxt;
  }
  if (p_Var2 == (_Hash_node_base *)0x0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.h"
                  ,0xff,
                  "const std::set<spv::ExecutionModel> *spvtools::val::ValidationState_t::GetExecutionModels(uint32_t) const"
                 );
  }
  return (set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
          *)(p_Var2 + 2);
}

Assistant:

const std::set<spv::ExecutionModel>* GetExecutionModels(
      uint32_t entry_point) const {
    const auto it = entry_point_to_execution_models_.find(entry_point);
    if (it == entry_point_to_execution_models_.end()) {
      assert(0);
      return nullptr;
    }
    return &it->second;
  }